

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O0

size_t helics::detail::convertToBinary(byte *data,double *val,size_t size)

{
  long in_RDX;
  byte *in_RSI;
  long in_RDI;
  
  addCodeAndSize(in_RSI,(byte)((ulong)in_RDX >> 0x38),0x3a67c5);
  if (in_RDX != 0) {
    memcpy((void *)(in_RDI + 8),in_RSI,in_RDX << 3);
  }
  return in_RDX * 8 + 8;
}

Assistant:

size_t convertToBinary(std::byte* data, const double* val, size_t size)
{
    addCodeAndSize(data, vectorCode, size);
    if (size > 0) {
        std::memcpy(data + 8, val, size * sizeof(double));
    }
    return size * sizeof(double) + 8U;
}